

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O1

string * __thiscall
Catch::Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
          (string *__return_storage_ptr__,MatcherUntypedBase *this)

{
  pointer pcVar1;
  long *local_40 [2];
  long local_30 [2];
  
  if ((this->m_cachedToString)._M_string_length == 0) {
    (*this->_vptr_MatcherUntypedBase[2])((string *)local_40,this);
    std::__cxx11::string::operator=((string *)&this->m_cachedToString,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_cachedToString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->m_cachedToString)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string MatcherUntypedBase::toString() const {
            if( m_cachedToString.empty() )
                m_cachedToString = describe();
            return m_cachedToString;
        }